

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynlib_unix.cpp
# Opt level: O0

bool __thiscall trun::DynLibLinux::IsValidTestFunc(DynLibLinux *this,string *funcName)

{
  size_type sVar1;
  string *funcName_local;
  DynLibLinux *this_local;
  
  sVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                    (funcName,"test_",0);
  if (sVar1 == 0) {
    this_local._7_1_ = true;
  }
  else {
    sVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                      (funcName,"_test_",0);
    if (sVar1 == 0) {
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool DynLibLinux::IsValidTestFunc(std::string funcName) {
    // The function table is what really matters
    if (funcName.find("test_",0) == 0) {
        return true;
    }
    if (funcName.find("_test_",0) == 0) {
        return true;
    }
    return false;
}